

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O1

void __thiscall vigra::ViffDecoder::~ViffDecoder(ViffDecoder *this)

{
  ViffDecoderImpl *pVVar1;
  void *pvVar2;
  pointer pcVar3;
  pointer pvVar4;
  
  (this->super_Decoder)._vptr_Decoder = (_func_int **)&PTR__ViffDecoder_0015d9e0;
  pVVar1 = this->pimpl;
  if (pVVar1 != (ViffDecoderImpl *)0x0) {
    pvVar2 = (pVVar1->bands).m_data;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    pvVar2 = (pVVar1->maps).m_data;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    pcVar3 = (pVVar1->pixelType)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(pVVar1->pixelType).field_2) {
      operator_delete(pcVar3);
    }
    operator_delete(pVVar1);
  }
  (this->super_Decoder)._vptr_Decoder = (_func_int **)&PTR__Decoder_0015c938;
  pvVar4 = (this->super_Decoder).iccProfile_.super_ArrayVectorView<unsigned_char>.data_;
  if (pvVar4 != (pointer)0x0) {
    operator_delete(pvVar4);
    return;
  }
  return;
}

Assistant:

ViffDecoder::~ViffDecoder()
    {
        delete pimpl;
    }